

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest_proto3_arena.pb.cc
# Opt level: O3

size_t __thiscall
proto3_arena_unittest::TestPickleNestedMessage_NestedMessage_NestedNestedMessage::ByteSizeLong
          (TestPickleNestedMessage_NestedMessage_NestedNestedMessage *this)

{
  long lVar1;
  ulong uVar2;
  size_t sVar3;
  
  if (((undefined1  [12])((undefined1  [12])this->field_0 & (undefined1  [12])0x1) ==
       (undefined1  [12])0x0) || (uVar2 = (ulong)(this->field_0)._impl_.cc_, uVar2 == 0)) {
    sVar3 = 0;
  }
  else {
    uVar2 = uVar2 | 1;
    lVar1 = 0x3f;
    if (uVar2 != 0) {
      for (; uVar2 >> lVar1 == 0; lVar1 = lVar1 + -1) {
      }
    }
    sVar3 = (size_t)((int)lVar1 * 9 + 0x89U >> 6);
  }
  sVar3 = google::protobuf::Message::MaybeComputeUnknownFieldsSize
                    (&this->super_Message,sVar3,&(this->field_0)._impl_._cached_size_);
  return sVar3;
}

Assistant:

::size_t TestPickleNestedMessage_NestedMessage_NestedNestedMessage::ByteSizeLong() const {
  const TestPickleNestedMessage_NestedMessage_NestedNestedMessage& this_ = *this;
#endif  // PROTOBUF_CUSTOM_VTABLE
  // @@protoc_insertion_point(message_byte_size_start:proto3_arena_unittest.TestPickleNestedMessage.NestedMessage.NestedNestedMessage)
  ::size_t total_size = 0;

  ::uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void)cached_has_bits;

   {
    // int32 cc = 1;
    cached_has_bits = this_._impl_._has_bits_[0];
    if ((cached_has_bits & 0x00000001u) != 0) {
      if (this_._internal_cc() != 0) {
        total_size += ::_pbi::WireFormatLite::Int32SizePlusOne(
            this_._internal_cc());
      }
    }
  }
  return this_.MaybeComputeUnknownFieldsSize(total_size,
                                             &this_._impl_._cached_size_);
}